

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_check.cpp
# Opt level: O0

bool CheckTransaction(CTransaction *tx,TxValidationState *state)

{
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  reference pCVar4;
  ValidationState<TxValidationResult> *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<COutPoint>,_bool> pVar5;
  CTxIn *txin_1;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range2;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1_1;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  CAmount nValueOut;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> vInOutPoints;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  CTransaction *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  undefined8 in_stack_fffffffffffffb70;
  TxValidationResult TVar6;
  ValidationState<TxValidationResult> *in_stack_fffffffffffffb78;
  allocator<char> *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffba8;
  size_type in_stack_fffffffffffffbac;
  bool local_303;
  allocator<char> local_302;
  allocator<char> local_301;
  CTxIn *local_300;
  CTxIn *local_2f8;
  allocator<char> local_2ec;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  _Base_ptr local_2e8;
  byte local_2e0;
  CTxIn *local_2d8;
  CTxIn *local_2d0;
  allocator<char> local_2c6;
  allocator<char> local_2c5;
  allocator<char> local_2c4;
  allocator<char> local_2c3;
  allocator<char> local_2c2;
  allocator<char> local_2c1;
  CTxOut *local_2c0;
  CTxOut *local_2b8;
  long local_2b0;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  ParamsWrapper<TransactionSerParams,_const_CTransaction> local_2a0;
  allocator<char> local_28c;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  _Base_ptr local_288;
  byte local_280;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::vector<CTxIn,_std::allocator<CTxIn>_>::empty
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                     CONCAT17(in_stack_fffffffffffffb6f,
                              CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    local_303 = ValidationState<TxValidationResult>::Invalid
                          (in_stack_fffffffffffffb78,TVar6,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffb6f,
                                    CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                           (string *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_28a);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_289);
    goto LAB_00e7f6ac;
  }
  bVar1 = std::vector<CTxOut,_std::allocator<CTxOut>_>::empty
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                     CONCAT17(in_stack_fffffffffffffb6f,
                              CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    local_303 = ValidationState<TxValidationResult>::Invalid
                          (in_stack_fffffffffffffb78,TVar6,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffb6f,
                                    CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                           (string *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_28c);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_28b);
    goto LAB_00e7f6ac;
  }
  local_2a0 = TransactionSerParams::operator()
                        ((TransactionSerParams *)
                         CONCAT17(in_stack_fffffffffffffb6f,
                                  CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                         in_stack_fffffffffffffb60);
  sVar3 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)
                     in_stack_fffffffffffffb60);
  TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  if (4000000 < sVar3 * 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
               in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    local_303 = ValidationState<TxValidationResult>::Invalid
                          (in_stack_fffffffffffffb78,TVar6,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffb6f,
                                    CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                           (string *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_2a2);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_2a1);
    goto LAB_00e7f6ac;
  }
  local_2b0 = 0;
  local_2b8 = (CTxOut *)
              std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb60);
  local_2c0 = (CTxOut *)
              std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffb60);
  while (bVar1 = __gnu_cxx::
                 operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                           ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                             *)CONCAT17(in_stack_fffffffffffffb6f,
                                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68
                                                )),
                            (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                             *)in_stack_fffffffffffffb60), ((bVar1 ^ 0xffU) & 1) != 0) {
    pCVar4 = __gnu_cxx::
             __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
             operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                        *)in_stack_fffffffffffffb58);
    TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
    if (pCVar4->nValue < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_303 = ValidationState<TxValidationResult>::Invalid
                            (in_stack_fffffffffffffb78,TVar6,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffb6f,
                                      CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68))
                             ,(string *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2c2);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2c1);
      goto LAB_00e7f6ac;
    }
    if (2100000000000000 < pCVar4->nValue) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_303 = ValidationState<TxValidationResult>::Invalid
                            (in_stack_fffffffffffffb78,TVar6,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffb6f,
                                      CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68))
                             ,(string *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2c4);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2c3);
      goto LAB_00e7f6ac;
    }
    local_2b0 = pCVar4->nValue + local_2b0;
    bVar1 = MoneyRange((CAmount *)in_stack_fffffffffffffb58);
    TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_303 = ValidationState<TxValidationResult>::Invalid
                            (in_stack_fffffffffffffb78,TVar6,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffb6f,
                                      CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68))
                             ,(string *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2c6);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2c5);
      goto LAB_00e7f6ac;
    }
    __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
    operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> *)
               in_stack_fffffffffffffb58);
  }
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_fffffffffffffb58);
  local_2d0 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                 (&in_stack_fffffffffffffb60->vin);
  local_2d8 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                 (&in_stack_fffffffffffffb60->vin);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                      ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)CONCAT17(in_stack_fffffffffffffb6f,
                                   CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                       (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                        *)in_stack_fffffffffffffb60);
    TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
              in_stack_fffffffffffffb58);
    pVar5 = std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::insert
                      ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
                       CONCAT17(in_stack_fffffffffffffb6f,
                                CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                       (value_type *)in_stack_fffffffffffffb60);
    TVar6 = (TxValidationResult)((ulong)in_stack_fffffffffffffb70 >> 0x20);
    local_2e8 = (_Base_ptr)pVar5.first._M_node;
    local_2e0 = pVar5.second;
    local_288 = local_2e8;
    local_280 = local_2e0;
    if (((local_2e0 ^ 0xff) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_303 = ValidationState<TxValidationResult>::Invalid
                            (in_stack_fffffffffffffb78,TVar6,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffb6f,
                                      CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68))
                             ,(string *)in_stack_fffffffffffffb60);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2ea);
      std::__cxx11::string::~string(in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(&local_2e9);
      goto LAB_00e7f68e;
    }
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_fffffffffffffb58);
  }
  bVar1 = CTransaction::IsCoinBase
                    ((CTransaction *)
                     CONCAT17(in_stack_fffffffffffffb6f,
                              CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
  if (bVar1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
               (size_type)in_stack_fffffffffffffb60);
    sVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_fffffffffffffb6f,
                                CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
    if (1 < sVar2) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_fffffffffffffb6f,
                          CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                 (size_type)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffbac =
           prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                     ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                      CONCAT17(in_stack_fffffffffffffb6f,
                               CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)));
      if (in_stack_fffffffffffffbac < 0x65) goto LAB_00e7f67b;
    }
    __s = &local_2eb;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),(char *)__s,
               (allocator<char> *)in_RSI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),(char *)__s,
               (allocator<char> *)in_RSI);
    local_303 = ValidationState<TxValidationResult>::Invalid
                          (in_stack_fffffffffffffb78,TVar6,
                           (string *)
                           CONCAT17(in_stack_fffffffffffffb6f,
                                    CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                           (string *)in_stack_fffffffffffffb60);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_2ec);
    std::__cxx11::string::~string(in_stack_fffffffffffffb58);
    std::allocator<char>::~allocator(&local_2eb);
  }
  else {
    local_2f8 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                   (&in_stack_fffffffffffffb60->vin);
    local_300 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                   (&in_stack_fffffffffffffb60->vin);
    while (bVar1 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)CONCAT17(in_stack_fffffffffffffb6f,
                                          CONCAT16(in_stack_fffffffffffffb6e,
                                                   in_stack_fffffffffffffb68)),
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffb60), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                in_stack_fffffffffffffb58);
      bVar1 = COutPoint::IsNull((COutPoint *)
                                CONCAT17(in_stack_fffffffffffffb6f,
                                         CONCAT16(in_stack_fffffffffffffb6e,
                                                  in_stack_fffffffffffffb68)));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        TVar6 = (TxValidationResult)((ulong)&local_302 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                   in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        local_303 = ValidationState<TxValidationResult>::Invalid
                              (in_RSI,TVar6,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffb6f,
                                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68
                                                )),(string *)in_stack_fffffffffffffb60);
        std::__cxx11::string::~string(in_stack_fffffffffffffb58);
        std::allocator<char>::~allocator(&local_302);
        std::__cxx11::string::~string(in_stack_fffffffffffffb58);
        std::allocator<char>::~allocator(&local_301);
        goto LAB_00e7f68e;
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_fffffffffffffb58);
    }
LAB_00e7f67b:
    local_303 = true;
  }
LAB_00e7f68e:
  std::set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_>::~set
            ((set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> *)
             in_stack_fffffffffffffb58);
LAB_00e7f6ac:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_303;
}

Assistant:

bool CheckTransaction(const CTransaction& tx, TxValidationState& state)
{
    // Basic checks that don't depend on any context
    if (tx.vin.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vin-empty");
    if (tx.vout.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-empty");
    // Size limits (this doesn't take the witness into account, as that hasn't been checked for malleability)
    if (::GetSerializeSize(TX_NO_WITNESS(tx)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-oversize");
    }

    // Check for negative or overflow output values (see CVE-2010-5139)
    CAmount nValueOut = 0;
    for (const auto& txout : tx.vout)
    {
        if (txout.nValue < 0)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-negative");
        if (txout.nValue > MAX_MONEY)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-toolarge");
        nValueOut += txout.nValue;
        if (!MoneyRange(nValueOut))
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-txouttotal-toolarge");
    }

    // Check for duplicate inputs (see CVE-2018-17144)
    // While Consensus::CheckTxInputs does check if all inputs of a tx are available, and UpdateCoins marks all inputs
    // of a tx as spent, it does not check if the tx has duplicate inputs.
    // Failure to run this check will result in either a crash or an inflation bug, depending on the implementation of
    // the underlying coins database.
    std::set<COutPoint> vInOutPoints;
    for (const auto& txin : tx.vin) {
        if (!vInOutPoints.insert(txin.prevout).second)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-inputs-duplicate");
    }

    if (tx.IsCoinBase())
    {
        if (tx.vin[0].scriptSig.size() < 2 || tx.vin[0].scriptSig.size() > 100)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-cb-length");
    }
    else
    {
        for (const auto& txin : tx.vin)
            if (txin.prevout.IsNull())
                return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-prevout-null");
    }

    return true;
}